

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

value * __thiscall picojson::value::operator=(value *this,value *x)

{
  undefined1 local_28 [8];
  value t;
  value *x_local;
  value *this_local;
  
  if (this != x) {
    t.u_ = (_storage)x;
    value((value *)local_28,x);
    swap(this,(value *)local_28);
    ~value((value *)local_28);
  }
  return this;
}

Assistant:

inline value &value::operator=(const value &x) {
  if (this != &x) {
    value t(x);
    swap(t);
  }
  return *this;
}